

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QPainterPath qt_regionToPath(QRegion *region)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  QRegionData *pQVar8;
  QRegionPrivate *pQVar9;
  qreal qVar10;
  int iVar11;
  long lVar12;
  QRect *pQVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  long *in_RSI;
  long lVar19;
  qreal *pqVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  QRect *pQVar25;
  QRect *pQVar26;
  qreal *pqVar27;
  double dVar28;
  undefined8 *puVar29;
  ulong uVar30;
  qreal *pqVar31;
  ulong uVar32;
  long in_FS_OFFSET;
  byte local_20bc;
  byte local_20bb;
  byte local_20ba;
  byte local_20b9;
  qreal *local_20b0;
  QPointF local_2068;
  QRectF local_2050 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  region->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)region);
  pQVar8 = (QRegionData *)*in_RSI;
  pQVar9 = pQVar8->qt_rgn;
  if (pQVar9 == (QRegionPrivate *)0x0) {
LAB_00431da2:
    pQVar25 = (QRect *)0x0;
  }
  else {
    if (pQVar9->numRects == 1) {
      lVar12 = -1;
      iVar11 = 0;
      if (pQVar8 == &QRegion::shared_empty) {
        uVar17 = 0;
      }
      else {
        pQVar9 = pQVar8->qt_rgn;
        uVar17 = 0;
        if (pQVar9->numRects != 0) {
          uVar17._0_4_ = (pQVar9->extents).x1;
          uVar17._4_4_ = (pQVar9->extents).y1;
          lVar12._0_4_ = (pQVar9->extents).x2;
          lVar12._4_4_ = (pQVar9->extents).y2;
          iVar11 = uVar17._4_4_;
        }
      }
      local_2050[0].xp = (qreal)(int)uVar17;
      local_2050[0].yp = (qreal)iVar11;
      local_2050[0].w = (qreal)(((long)(int)lVar12 - (long)(int)uVar17) + 1);
      local_2050[0].h = (qreal)(((lVar12 >> 0x20) - (long)iVar11) + 1);
      QPainterPath::addRect((QPainterPath *)region,local_2050);
      goto LAB_0043225d;
    }
    if (pQVar9 == (QRegionPrivate *)0x0) goto LAB_00431da2;
    if (pQVar9->numRects == 1) {
      pQVar25 = &pQVar9->extents;
    }
    else {
      pQVar25 = (pQVar9->rects).d.ptr;
    }
  }
  if (pQVar9 == (QRegionPrivate *)0x0) {
    pQVar13 = (QRect *)0x0;
  }
  else {
    if ((long)pQVar9->numRects == 1) {
      pQVar13 = &pQVar9->extents;
    }
    else {
      pQVar13 = (pQVar9->rects).d.ptr;
    }
    pQVar13 = pQVar13 + pQVar9->numRects;
  }
  memset(local_2050,0xaa,0x2018);
  local_2050[0].xp = 1.26480805335359e-321;
  local_2050[0].yp = 0.0;
  local_2050[0].w = (qreal)&local_2050[0].h;
  dVar28 = (double)((long)pQVar13 - (long)pQVar25 >> 2);
  if (0x100 < (long)dVar28) {
    qt_regionToPath();
  }
  if (pQVar25 == pQVar13) {
    uVar16 = 0;
  }
  else {
    iVar11 = 0;
    uVar16 = 0;
    local_20b0 = (qreal *)0x0;
    uVar22 = 0;
    do {
      iVar2 = (pQVar25->y1).m_i;
      uVar23 = 0;
      pQVar26 = pQVar25;
      do {
        if ((pQVar26->y1).m_i != iVar2) break;
        uVar23 = uVar23 + 1;
        pQVar26 = pQVar26 + 1;
      } while (pQVar26 != pQVar13);
      iVar14 = (int)uVar16;
      if (uVar23 != 0) {
        local_20b9 = local_20b9 & 0xfd;
        local_20ba = local_20ba & 0xfd;
        local_20bb = local_20bb & 0xfd;
        local_20bc = local_20bc & 0xfd;
        lVar12 = (long)(int)uVar23;
        uVar21 = 0;
        uVar32 = uVar16;
        do {
          lVar19 = uVar32 << 5;
          lVar1 = uVar21 + (long)iVar14;
          uVar17 = *(undefined8 *)(pQVar25 + uVar21);
          *(byte *)((long)local_2050[0].w + lVar1 * 4 * 8) = local_20b9;
          *(undefined8 *)((long)local_2050[0].w + lVar1 * 0x20 + 4) = uVar17;
          iVar3 = pQVar25[uVar21].y1.m_i;
          iVar4 = pQVar25[uVar21].x2.m_i;
          lVar24 = lVar1 + lVar12;
          *(byte *)((long)local_2050[0].w + lVar24 * 4 * 8) = local_20ba;
          *(ulong *)((long)local_2050[0].w + lVar24 * 0x20 + 4) = CONCAT44(iVar3,iVar4 + 1);
          iVar3 = pQVar25[uVar21].x2.m_i;
          iVar4 = pQVar25[uVar21].y2.m_i;
          lVar24 = lVar24 + lVar12;
          *(byte *)((long)local_2050[0].w + lVar24 * 4 * 8) = local_20bb;
          *(ulong *)((long)local_2050[0].w + lVar24 * 0x20 + 4) = CONCAT44(iVar4 + 1,iVar3 + 1);
          iVar3 = pQVar25[uVar21].x1.m_i;
          iVar4 = pQVar25[uVar21].y2.m_i;
          *(byte *)((long)local_2050[0].w + (lVar24 * 4 + lVar12 * 4) * 8) = local_20bc;
          *(ulong *)((long)local_2050[0].w + lVar12 * 0x20 + 4 + lVar24 * 0x20) =
               CONCAT44(iVar4 + 1,iVar3);
          lVar24 = 1;
          do {
            uVar30 = (ulong)(uVar23 * ((uint)lVar24 & 3) + (int)lVar1);
            *(qreal **)((long)local_2050[0].w + lVar19 + 0x18) =
                 (qreal *)((long)local_2050[0].w + uVar30 * 4 * 8);
            *(long *)((long)local_2050[0].w + (uVar30 * 4 + 2) * 8) = (long)local_2050[0].w + lVar19
            ;
            *(byte *)((long)local_2050[0].w + lVar19) =
                 *(byte *)((long)local_2050[0].w + lVar19) & 0xfe |
                 *(int *)((long)local_2050[0].w + lVar19 + 8) ==
                 *(int *)((long)local_2050[0].w + (uVar30 * 4 + 1) * 8);
            lVar19 = lVar19 + (ulong)uVar23 * 0x20;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 5);
          uVar21 = uVar21 + 1;
          uVar32 = (ulong)((int)uVar32 + 1);
        } while (uVar21 != uVar23);
      }
      if (((local_20b0 != (qreal *)0x0) && (iVar11 == iVar2)) && (uVar23 != 0 && uVar22 != 0)) {
        uVar15 = 0;
        uVar32 = 0;
        do {
          uVar21 = (ulong)uVar15;
          iVar11 = *(int *)((long)local_20b0 + uVar21 * 0x20 + 4);
          iVar3 = *(int *)((long)local_20b0[uVar21 * 4 + 3] + 4);
          iVar4 = iVar3;
          if (iVar3 < iVar11) {
            iVar4 = iVar11;
          }
          iVar5 = *(int *)((long)local_2050[0].w + uVar32 * 0x20 + uVar16 * 0x20 + 4);
          qVar10 = *(qreal *)((long)local_2050[0].w + (uVar16 * 4 + uVar32 * 4 + 3) * 8);
          iVar6 = *(int *)((long)qVar10 + 4);
          if (iVar11 < iVar3) {
            iVar3 = iVar11;
          }
          iVar11 = iVar6;
          if (iVar6 < iVar5) {
            iVar11 = iVar5;
          }
          if (iVar5 < iVar6) {
            iVar6 = iVar5;
          }
          if ((iVar3 < iVar11) && (iVar6 < iVar4)) {
            pqVar20 = local_20b0 + uVar21 * 4;
            pqVar31 = (qreal *)((long)local_2050[0].w + (uVar16 * 4 + uVar32 * 4) * 8);
            if (iVar11 < iVar4) {
              pqVar31[3] = local_20b0[uVar21 * 4 + 3];
              *(qreal **)((long)pqVar20[3] + 0x10) = pqVar31;
              pqVar20[3] = qVar10;
              puVar29 = (undefined8 *)((long)qVar10 + 0x10);
            }
            else {
              uVar7 = *(undefined4 *)(pqVar31 + 1);
              lVar12 = (long)pqVar31[2];
              *(undefined8 *)((long)pqVar31 + 4) = *(undefined8 *)((long)pqVar20 + 4);
              pqVar31[2] = pqVar20[2];
              *(qreal **)((long)pqVar20[2] + 0x18) = pqVar31;
              *(int *)((long)pqVar20 + 4) = iVar5;
              *(undefined4 *)(pqVar20 + 1) = uVar7;
              pqVar20[2] = (qreal)lVar12;
              puVar29 = (undefined8 *)(lVar12 + 0x18);
            }
            *puVar29 = pqVar20;
          }
          uVar15 = uVar15 + (iVar4 <= iVar11);
        } while ((uVar15 != uVar22) &&
                (uVar18 = (int)uVar32 + (uint)(iVar11 <= iVar4), uVar32 = (ulong)uVar18,
                uVar18 != uVar23));
      }
      local_20b0 = (qreal *)((long)local_2050[0].w + (ulong)(iVar14 + uVar23 * 2) * 4 * 8);
      uVar16 = (ulong)(iVar14 + uVar23 * 4);
      iVar11 = ((iVar2 + (pQVar25->y2).m_i) - (pQVar25->y1).m_i) + 1;
      pQVar25 = pQVar26;
      uVar22 = uVar23;
    } while (pQVar26 != pQVar13);
  }
  local_2050[0].yp = dVar28;
  if ((int)uVar16 != 0) {
    uVar32 = 0;
    do {
      if (((ulong)*(qreal *)((long)local_2050[0].w + uVar32 * 4 * 8) & 2) == 0) {
        pqVar27 = (qreal *)((long)local_2050[0].w + uVar32 * 4 * 8);
        dVar28 = (double)(int)((ulong)*(undefined8 *)((long)pqVar27 + 4) >> 0x20);
        local_2068.yp._0_4_ = SUB84(dVar28,0);
        local_2068.xp = (double)(int)*(undefined8 *)((long)pqVar27 + 4);
        local_2068.yp._4_4_ = (int)((ulong)dVar28 >> 0x20);
        QPainterPath::moveTo((QPainterPath *)region,&local_2068);
        *(byte *)pqVar27 = *(byte *)pqVar27 | 2;
        pqVar20 = pqVar27;
        for (pqVar31 = (qreal *)pqVar27[3]; pqVar31 != pqVar27; pqVar31 = (qreal *)pqVar31[3]) {
          if (((*(byte *)pqVar20 ^ *(byte *)pqVar31) & 1) != 0) {
            dVar28 = (double)(int)((ulong)*(undefined8 *)((long)pqVar31 + 4) >> 0x20);
            local_2068.yp._0_4_ = SUB84(dVar28,0);
            local_2068.xp = (double)(int)*(undefined8 *)((long)pqVar31 + 4);
            local_2068.yp._4_4_ = (int)((ulong)dVar28 >> 0x20);
            QPainterPath::lineTo((QPainterPath *)region,&local_2068);
          }
          *(byte *)pqVar31 = *(byte *)pqVar31 | 2;
          pqVar20 = pqVar31;
        }
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar16);
  }
  if ((qreal *)local_2050[0].w != &local_2050[0].h) {
    QtPrivate::sizedFree((void *)local_2050[0].w,(long)local_2050[0].xp << 5);
  }
LAB_0043225d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)region;
}

Assistant:

Q_GUI_EXPORT QPainterPath qt_regionToPath(const QRegion &region)
{
    QPainterPath result;
    if (region.rectCount() == 1) {
        result.addRect(region.boundingRect());
        return result;
    }

    auto rect = region.begin();
    const auto end = region.end();

    QVarLengthArray<Segment> segments;
    segments.resize(4 * (end - rect));

    int lastRowSegmentCount = 0;
    Segment *lastRowSegments = nullptr;

    int lastSegment = 0;
    int lastY = 0;
    while (rect != end) {
        const int y = rect[0].y();
        int count = 0;
        while (&rect[count] != end && rect[count].y() == y)
            ++count;

        for (int i = 0; i < count; ++i) {
            int offset = lastSegment + i;
            segments[offset] = Segment(rect[i].topLeft());
            segments[offset += count] = Segment(rect[i].topRight() + QPoint(1, 0));
            segments[offset += count] = Segment(rect[i].bottomRight() + QPoint(1, 1));
            segments[offset += count] = Segment(rect[i].bottomLeft() + QPoint(0, 1));

            offset = lastSegment + i;
            for (int j = 0; j < 4; ++j)
                segments[offset + j * count].connect(segments[offset + ((j + 1) % 4) * count]);
        }

        if (lastRowSegments && lastY == y)
            mergeSegments(lastRowSegments, lastRowSegmentCount, &segments[lastSegment], count);

        lastRowSegments = &segments[lastSegment + 2 * count];
        lastRowSegmentCount = count;
        lastSegment += 4 * count;
        lastY = y + rect[0].height();
        rect += count;
    }

    for (int i = 0; i < lastSegment; ++i) {
        Segment *segment = &segments[i];
        if (!segment->added)
            addSegmentsToPath(segment, result);
    }

    return result;
}